

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMatterMeshless::VariablesFbLoadForces(ChMatterMeshless *this,double factor)

{
  ChSystem *pCVar1;
  __shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  element_type *peVar4;
  double dVar5;
  undefined *puVar6;
  element_type *peVar7;
  undefined1 auVar8 [56];
  pointer psVar9;
  ChStrainTensor<double> *pCVar10;
  __shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  uint uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [64];
  shared_ptr<chrono::fea::ChNodeMeshless> mnode;
  shared_ptr<chrono::ChProximityContainerMeshless> edges;
  ChVector<double> v;
  shared_ptr<chrono::ChPhysicsItem> otherphysics;
  ChStrainTensor<double> strainplasticflow;
  ChStrainTensor<double> proj_e_strain;
  __shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  __shared_ptr<chrono::ChProximityContainerMeshless,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  Matrix<double,_3,_3,_1,_3,_3> local_1a8;
  ChMatterMeshless *local_160;
  double local_158;
  double local_150;
  undefined1 local_148 [48];
  double dStack_118;
  ChSystem *pCStack_110;
  element_type *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  ChMatrix33<double> *local_f8;
  scalar_constant_op<double> local_f0;
  RhsNested local_e8;
  ChStrainTensor<double> *local_e0;
  Matrix<double,_3,_3,_1,_3,_3> *local_d8;
  AddProximityCallback *local_d0;
  __shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2> local_c8 [3];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
  local_90;
  Matrix<double,_3,_3,_1,_3,_3> *local_68 [7];
  undefined1 extraout_var [56];
  
  local_1b8._M_ptr = (ChProximityContainerMeshless *)0x0;
  local_1b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pCVar1 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
  p_Var11 = &((pCVar1->assembly).otherphysicslist.
              super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>;
  p_Var2 = &((pCVar1->assembly).otherphysicslist.
             super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>;
  local_150 = factor;
  do {
    if (p_Var11 == p_Var2) break;
    std::__shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2> *)local_148,p_Var11)
    ;
    std::dynamic_pointer_cast<chrono::ChProximityContainerMeshless,chrono::ChPhysicsItem>
              ((shared_ptr<chrono::ChPhysicsItem> *)&local_1a8);
    std::__shared_ptr<chrono::ChProximityContainerMeshless,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_1b8,
               (__shared_ptr<chrono::ChProximityContainerMeshless,_(__gnu_cxx::_Lock_policy)2> *)
               &local_1a8);
    peVar7 = local_1b8._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array + 1));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
    p_Var11 = p_Var11 + 1;
  } while (peVar7 == (ChProximityContainerMeshless *)0x0);
  if (local_1b8._M_ptr == (ChProximityContainerMeshless *)0x0) {
    __assert_fail("edges",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMatterMeshless.cpp"
                  ,0x1da,"virtual void chrono::fea::ChMatterMeshless::VariablesFbLoadForces(double)"
                 );
  }
  psVar9 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar12 = 0; uVar13 = (ulong)uVar12,
      uVar13 < (ulong)((long)(this->nodes).
                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4);
      uVar12 = uVar12 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)
               &(psVar9[uVar13].
                 super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->J);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)
               &((this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar13].
                 super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->Amoment);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
               &((this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar13].
                 super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->t_strain);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
               &((this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar13].
                 super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->e_stress);
    puVar6 = DAT_011dd3e0;
    psVar9 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar3 = psVar9[uVar13].
             super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 != (element_type *)&PTR_typeinfo_011dd158) {
      (peVar3->UserForce).m_data[0] = (double)VNULL;
      (peVar3->UserForce).m_data[1] = (double)puVar6;
      (peVar3->UserForce).m_data[2] = (double)DAT_011dd3e8;
    }
    peVar3->density = 0.0;
  }
  ChProximityContainerMeshless::AccumulateStep1(local_1b8._M_ptr);
  uVar12 = 0;
  local_160 = this;
  while( true ) {
    psVar9 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = (ulong)uVar12;
    if ((ulong)((long)(this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4) <= uVar13) {
      ChProximityContainerMeshless::AccumulateStep2(local_1b8._M_ptr);
      uVar12 = 0;
      while( true ) {
        psVar9 = (this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar13 = (ulong)uVar12;
        if ((ulong)((long)(this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4) <= uVar13)
        {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8._M_refcount);
          return;
        }
        pCVar1 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
        dVar15 = (double)(**(code **)(*(long *)&(psVar9[uVar13].
                                                 super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr)->super_ChNodeXYZ + 0x90))();
        auVar16 = (undefined1  [64])
                  local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array._0_64_;
        psVar9 = (this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        peVar3 = psVar9[uVar13].
                 super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[1] = (double)(dVar15 * (pCVar1->G_acc).m_data[1] + (peVar3->UserForce).m_data[1]);
        local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[0] = (double)(dVar15 * (pCVar1->G_acc).m_data[0] + (peVar3->UserForce).m_data[0]);
        local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array._24_40_ = auVar16._24_40_;
        local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[2] = dVar15 * (pCVar1->G_acc).m_data[2] + (peVar3->UserForce).m_data[2];
        std::__shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (local_c8,&psVar9[uVar13].
                             super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                  );
        if (local_c8[0]._M_ptr == (element_type *)0x0) break;
        local_68[0] = &local_1a8;
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                          *)local_148,&local_150,(StorageBaseType *)local_68);
        ChVariables::Get_fb((ChVectorRef *)&local_100,
                            &((local_c8[0]._M_ptr)->variables).super_ChVariables);
        Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>>::
        operator+=((MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                    *)&local_100,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)local_148);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8[0]._M_refcount);
        uVar12 = uVar12 + 1;
      }
      __assert_fail("mnode",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMatterMeshless.cpp"
                    ,0x237,
                    "virtual void chrono::fea::ChMatterMeshless::VariablesFbLoadForces(double)");
    }
    std::__shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1c8,
               &psVar9[uVar13].
                super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>);
    if (local_1c8._M_ptr == (element_type *)0x0) break;
    dVar15 = 0.0;
    if (0.0 < (local_1c8._M_ptr)->density) {
      dVar15 = (double)(**(code **)((long)((local_1c8._M_ptr)->super_ChNodeXYZ).super_ChLoadableUVW
                                   + 0x90))();
      dVar15 = dVar15 / (local_1c8._M_ptr)->density;
    }
    (local_1c8._M_ptr)->volume = dVar15;
    local_108 = (element_type *)
                ((local_1c8._M_ptr)->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [8];
    local_148._0_8_ =
         ((local_1c8._M_ptr)->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_148._8_8_ =
         ((local_1c8._M_ptr)->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_148._16_8_ =
         ((local_1c8._M_ptr)->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_148._24_8_ =
         ((local_1c8._M_ptr)->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    local_148._32_8_ =
         ((local_1c8._M_ptr)->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    local_148._40_8_ =
         ((local_1c8._M_ptr)->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    dStack_118 = ((local_1c8._M_ptr)->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
    pCStack_110 = (ChSystem *)
                  ((local_1c8._M_ptr)->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[7];
    auVar16._0_8_ =
         Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run
                   ((Matrix<double,_3,_3,_1,_3,_3> *)local_148);
    auVar16._8_56_ = extraout_var;
    auVar14._8_8_ = 0x7fffffffffffffff;
    auVar14._0_8_ = 0x7fffffffffffffff;
    auVar14 = vandpd_avx512vl(auVar16._0_16_,auVar14);
    if (3e-05 <= auVar14._0_8_) {
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [0] = (double)local_148;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>>
                (&((local_1c8._M_ptr)->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>,
                 (Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_1a8);
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [1] = (double)&(local_1c8._M_ptr)->J;
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [0] = (double)&(local_1c8._M_ptr)->Amoment;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)local_148,
                 (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                  *)&local_1a8);
      local_148._0_8_ = (double)local_148._0_8_ + 1.0;
      local_148._32_8_ = (double)local_148._32_8_ + 1.0;
      local_108 = (element_type *)((double)local_108 + 1.0);
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [0] = (double)local_148;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
                (&((local_1c8._M_ptr)->J).super_Matrix<double,_3,_3,_1,_3,_3>,
                 (Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_1a8);
      local_f8 = &(local_1c8._M_ptr)->J;
      local_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
      _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_1a8,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_100);
      auVar8 = (undefined1  [56])
               local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array._8_56_;
      dVar15 = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[0] + -1.0;
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [0] = dVar15;
      auVar16 = (undefined1  [64])
                local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array._0_64_;
      dVar5 = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
              m_data.array[4] + -1.0;
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array.
      _0_32_ = auVar16._0_32_;
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [4] = dVar5;
      auVar16 = (undefined1  [64])
                local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array._0_64_;
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [8] = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] + -1.0;
      ((local_1c8._M_ptr)->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
           dVar15;
      ((local_1c8._M_ptr)->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = dVar5
      ;
      ((local_1c8._M_ptr)->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
           local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[8];
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [1] = auVar8._0_8_;
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [2] = auVar8._8_8_;
      ((local_1c8._M_ptr)->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
           local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[1];
      ((local_1c8._M_ptr)->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
           local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[2];
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [5] = auVar8._32_8_;
      ((local_1c8._M_ptr)->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
           local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[5];
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array.
      _0_64_ = auVar16;
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_c8);
      this = local_160;
      peVar4 = (local_160->material).
               super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      peVar3 = (local_160->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].
               super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar4->super_ChContinuumElastic).super_ChContinuumMaterial._vptr_ChContinuumMaterial[6])
                (peVar4,local_c8,&peVar3->t_strain,&peVar3->e_strain,&peVar3->p_strain);
      peVar3 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].
               super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pCVar10 = &peVar3->e_strain;
      local_e0 = &peVar3->t_strain;
      local_f8 = (ChMatrix33<double> *)pCVar10;
      local_f0.m_other = (double)local_c8;
      Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)local_68,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                  *)&local_100);
      ChContinuumElastic::ComputeElasticStress
                (&((this->material).
                   super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_ChContinuumElastic,&(local_1c8._M_ptr)->e_stress,
                 (ChStrainTensor<double> *)local_68);
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [8] = ((local_1c8._M_ptr)->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array.
      _0_64_ = vgatherdpd_avx512f(*(undefined4 *)
                                   ((long)((local_1c8._M_ptr)->super_ChNodeXYZ).pos.m_data +
                                   (long)(pCVar10[0xffffffffffffffff].super_ChVoightTensor<double>.
                                          super_ChVectorN<double,_6>.
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                          .m_storage.m_data.array + 5)));
      local_158 = (local_1c8._M_ptr)->volume + (local_1c8._M_ptr)->volume;
      Eigen::operator*(&local_90,&local_158,(StorageBaseType *)&(local_1c8._M_ptr)->J);
      local_d8 = &local_1a8;
      local_d0 = (AddProximityCallback *)&(local_1c8._M_ptr)->Amoment;
      local_f0.m_other = local_90.m_lhs.m_functor.m_other;
      local_e8 = local_90.m_rhs;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Matrix<double,3,3,1,3,3>const>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                (&((local_1c8._M_ptr)->FA).super_Matrix<double,_3,_3,_1,_3,_3>,
                 (Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                  *)&local_100);
    }
    else {
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&(local_1c8._M_ptr)->Amoment);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&(local_1c8._M_ptr)->e_strain);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
    uVar12 = uVar12 + 1;
  }
  __assert_fail("mnode",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMatterMeshless.cpp"
                ,0x1ef,"virtual void chrono::fea::ChMatterMeshless::VariablesFbLoadForces(double)");
}

Assistant:

void ChMatterMeshless::VariablesFbLoadForces(double factor) {
    // COMPUTE THE MESHLESS FORCES HERE

    // First, find if any ChProximityContainerMeshless object is present
    // in the system,

    std::shared_ptr<ChProximityContainerMeshless> edges;
    for (auto otherphysics : GetSystem()->Get_otherphysicslist()) {
        if ((edges = std::dynamic_pointer_cast<ChProximityContainerMeshless>(otherphysics)))
            break;
    }
    assert(edges);  // If using a ChMatterMeshless, you must add also a ChProximityContainerMeshless.

    // 1- Per-node initialization

    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->J.setZero();
        nodes[j]->Amoment.setZero();
        nodes[j]->t_strain.setZero();
        nodes[j]->e_stress.setZero();
        nodes[j]->UserForce = VNULL;
        nodes[j]->density = 0;
    }

    // 2- Per-edge initialization and accumulation of values in particles's J, Amoment, m_v, density

    edges->AccumulateStep1();

    // 3- Per-node inversion of A and computation of strain stress

    for (unsigned int j = 0; j < nodes.size(); j++) {
        std::shared_ptr<ChNodeMeshless> mnode(nodes[j]);
        assert(mnode);

        // node volume is v=mass/density
        if (mnode->density > 0)
            mnode->volume = mnode->GetMass() / mnode->density;
        else
            mnode->volume = 0;

        // Compute A inverse
        ChMatrix33<> M_tmp = mnode->Amoment;

        if (std::abs(M_tmp.determinant()) < 0.00003) {
            mnode->Amoment.setZero();     // deactivate if not possible to invert
            mnode->e_strain.setZero();  // detach
        } else {
            mnode->Amoment = M_tmp.inverse();

            // Compute J = ( A^-1 * [dwg | dwg | dwg] )' + I
            M_tmp = mnode->Amoment * mnode->J;
            M_tmp(0, 0) += 1;
            M_tmp(1, 1) += 1;
            M_tmp(2, 2) += 1;
            mnode->J = M_tmp.transpose();

            // Compute step strain tensor  de = J'*J - I
            ChMatrix33<> mtensor = M_tmp * mnode->J;
            mtensor(0, 0) -= 1;
            mtensor(1, 1) -= 1;
            mtensor(2, 2) -= 1;

            mnode->t_strain.ConvertFromMatrix(mtensor);  // store 'step strain' de, change in total strain

            ChStrainTensor<> strainplasticflow;
            material->ComputeReturnMapping(strainplasticflow,   // dEp, flow of elastic strain (correction)
                                           nodes[j]->t_strain,  // increment of total strain
                                           nodes[j]->e_strain,  // last elastic strain
                                           nodes[j]->p_strain   // last plastic strain
                                           );
            ChStrainTensor<> proj_e_strain = nodes[j]->e_strain - strainplasticflow + nodes[j]->t_strain;
            GetMaterial()->ComputeElasticStress(mnode->e_stress, proj_e_strain);
            mnode->e_stress.ConvertToMatrix(mtensor);

            /*
            // Compute elastic stress tensor  sigma= C*epsilon
            //   NOTE: it should be better to perform stress computation on corrected e_strain, _after_ the
            //   return mapping (see later), but for small timestep it could be the same.
            ChStrainTensor<> guesstot_e_strain; // anticipate the computation of total strain for anticipating strains
            guesstot_e_strain.MatrAdd(mnode->e_strain, mnode->t_strain);
            GetMaterial()->ComputeElasticStress(mnode->e_stress, guesstot_e_strain);
            mnode->e_stress.ConvertToMatrix(mtensor);
            */

            // Precompute 2*v*J*sigma*A^-1
            mnode->FA = (2 * mnode->volume) * mnode->J * mtensor * mnode->Amoment;
        }
    }

    // 4- Per-edge force transfer from stress, and add also viscous forces

    edges->AccumulateStep2();

    // 5- Per-node load force

    for (unsigned int j = 0; j < nodes.size(); j++) {
        // particle gyroscopic force:
        // none.

        // add gravity
        ChVector<> Gforce = GetSystem()->Get_G_acc() * nodes[j]->GetMass();
        ChVector<> TotForce = nodes[j]->UserForce + Gforce;

        std::shared_ptr<ChNodeMeshless> mnode(nodes[j]);
        assert(mnode);

        mnode->variables.Get_fb() += factor * TotForce.eigen();
    }
}